

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

int __thiscall Fl_Tree::select_only(Fl_Tree *this,Fl_Tree_Item *selitem,int docallback)

{
  char cVar1;
  fd_set *in_RCX;
  fd_set *in_R8;
  timeval *in_R9;
  Fl_Tree_Item *local_40;
  Fl_Tree_Item *local_30;
  Fl_Tree_Item *item;
  int changed;
  int docallback_local;
  Fl_Tree_Item *selitem_local;
  Fl_Tree *this_local;
  
  local_40 = selitem;
  if (selitem == (Fl_Tree_Item *)0x0) {
    local_40 = first(this);
  }
  if (local_40 == (Fl_Tree_Item *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    item._0_4_ = 0;
    for (local_30 = first(this); local_30 != (Fl_Tree_Item *)0x0;
        local_30 = Fl_Tree_Item::next(local_30)) {
      if ((local_30 != local_40) && (cVar1 = Fl_Tree_Item::is_selected(local_30), cVar1 != '\0')) {
        deselect(this,local_30,docallback);
        item._0_4_ = (int)item + 1;
      }
    }
    cVar1 = Fl_Tree_Item::is_selected(local_40);
    if (cVar1 == '\0') {
      select(this,(int)local_40,(fd_set *)(ulong)(uint)docallback,in_RCX,in_R8,in_R9);
      item._0_4_ = (int)item + 1;
    }
    this_local._4_4_ = (int)item;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Tree::select_only(Fl_Tree_Item *selitem, int docallback) {
  selitem = selitem ? selitem : first();	// NULL? use first()
  if ( ! selitem ) return(0);
  int changed = 0;
  // Deselect everything first.
  //    Prevents callbacks from seeing more than one item selected.
  //
  for ( Fl_Tree_Item *item = first(); item; item = item->next() ) {
    if ( item == selitem ) continue;		// don't do anything to selitem yet..
    if ( item->is_selected() ) {
      deselect(item, docallback);
      ++changed;
    }
  }
#if FLTK_ABI_VERSION >= 10301
  // Should we 'reselect' item if already selected?
  if ( selitem->is_selected() && (item_reselect_mode()==FL_TREE_SELECTABLE_ALWAYS) ) {
    // Selection unchanged, so no ++changed
    select(selitem, docallback);			// do callback with reason=reselect
  } else if ( !selitem->is_selected() ) {
    // Item was not already selected, select and indicate changed
    select(selitem, docallback);
    ++changed;
  }
#else
  if ( !selitem->is_selected() ) {
    // All items deselected, now select the one we want
    select(selitem, docallback);
    ++changed;
  }
#endif
  return(changed);
}